

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardOptions.hpp
# Opt level: O1

void __thiscall
Configurable::DisplayOption<Sinclair::ZXSpectrum::Machine::Options>::declare_display_option
          (DisplayOption<Sinclair::ZXSpectrum::Machine::Options> *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"output","");
  Reflection::StructImpl<Sinclair::ZXSpectrum::Machine::Options>::
  declare_emplace<Configurable::Display>
            ((StructImpl<Sinclair::ZXSpectrum::Machine::Options> *)(this + -2),&this->output,
             &local_38,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  Reflection::Enum::declare<Configurable::Display>
            ("Display","RGB, SVideo, CompositeColour, CompositeMonochrome");
  return;
}

Assistant:

void declare_display_option() {
			static_cast<Owner *>(this)->declare(&output, "output");
			AnnounceEnumNS(Configurable, Display);
		}